

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O3

void skiwi::inline_fl_min(asmcode *code,compiler_options *param_2)

{
  skiwi *this;
  uint64_t in_RDX;
  string done;
  operand local_40 [2];
  undefined8 local_38;
  operand local_2c;
  string local_28;
  
  this = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_28,this,in_RDX);
  local_40[1] = 2;
  local_40[0] = RAX;
  local_2c = NUMBER;
  local_38 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_40 + 1,local_40,&local_2c,&local_38);
  local_40[1] = 2;
  local_40[0] = RBX;
  local_2c = NUMBER;
  local_38 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_40 + 1,local_40,&local_2c,&local_38);
  local_38._0_4_ = MOVSD;
  local_40[1] = 0x43;
  local_40[0] = MEM_RAX;
  local_2c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_40 + 1,local_40,(int *)&local_2c);
  local_38._0_4_ = MOVSD;
  local_40[1] = 0x44;
  local_40[0] = MEM_RBX;
  local_2c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_40 + 1,local_40,(int *)&local_2c);
  local_38._0_4_ = UCOMISD;
  local_40[1] = 0x43;
  local_40[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,local_40);
  local_38._0_4_ = JBS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_38,&local_28);
  local_38._0_4_ = MOVSD;
  local_40[1] = 0x43;
  local_40[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,local_40);
  local_38._0_4_ = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_38,&local_28);
  local_38._0_4_ = MOV;
  local_40[1] = 9;
  local_40[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,local_40);
  local_38._0_4_ = MOV;
  local_40[1] = 0x20;
  local_40[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,local_40);
  local_38._0_4_ = MOVSD;
  local_40[1] = 0x20;
  local_40[0] = DH;
  local_2c = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,(int *)local_40,&local_2c);
  local_38._0_4_ = MOV;
  local_40[1] = 9;
  local_40[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_40 + 1,local_40);
  local_38._0_4_ = OR;
  local_40[1] = 9;
  local_40[0] = NUMBER;
  local_2c = CL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_40 + 1,local_40,(int *)&local_2c);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  local_40[1] = 0x10;
  local_40[0] = NUMBER;
  local_2c = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_40 + 1,local_40,(int *)&local_2c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inline_fl_min(ASM::asmcode& code, const compiler_options&)
  {
  auto done = label_to_string(label++);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::UCOMISD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::JBS, done);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::LABEL, done);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }